

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void int_linear_imp(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  BoolView local_30;
  BoolView local_20;
  
  iVar3 = -c;
  if (0 < c) {
    iVar3 = c;
  }
  dVar5 = (double)iVar3;
  if ((ulong)x->sz == 0) {
    bVar1 = false;
  }
  else {
    uVar4 = 0;
    bVar2 = false;
    do {
      bVar1 = true;
      if (a->data[uVar4] == -1) {
        bVar1 = bVar2;
      }
      if (a->data[uVar4] == 1) {
        bVar1 = bVar2;
      }
      dVar5 = dVar5 + 2147483647.0;
      uVar4 = uVar4 + 1;
      bVar2 = bVar1;
    } while (x->sz != uVar4);
  }
  if (9.223372036854776e+18 <= dVar5) {
    int_linear_imp();
  }
  if ((uint)r->s * -2 + 1 != (int)sat.assigns.data[(uint)r->v]) {
    if (bVar1) {
      local_20.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_20.v = r->v;
      local_20.s = r->s;
      int_linear_imp<1>(a,x,t,c,&local_20);
    }
    else {
      local_30.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_0020fb28;
      local_30.v = r->v;
      local_30.s = r->s;
      int_linear_imp<0>(a,x,t,c,&local_30);
    }
    return;
  }
  if (!bVar1) {
    int_linear<0>(a,x,t,c);
    return;
  }
  int_linear<1>(a,x,t,c);
  return;
}

Assistant:

void int_linear_imp(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, const BoolView& r) {
	assert(a.size() == x.size());

	bool scale = false;
	double limit = abs(c);
	for (unsigned int i = 0; i < x.size(); i++) {
		assert(a[i]);
		if (a[i] != 1 && a[i] != -1) {
			scale = true;
		}
		limit += abs(a[i]) * IntVar::max_limit + INT_MAX;
	}
	if (limit >= INT64_MAX) {
		CHUFFED_ERROR("Linear constraint may overflow, not yet supported\n");
	}

	if (r.isTrue()) {
		if (scale) {
			int_linear<1>(a, x, t, c);
		} else {
			int_linear<0>(a, x, t, c);
		}
	} else {
		if (scale) {
			int_linear_imp<1>(a, x, t, c, r);
		} else {
			int_linear_imp<0>(a, x, t, c, r);
		}
	}
}